

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dj_algebra.h
# Opt level: O3

mat3 * dja::mat3::scale(vec3 *values)

{
  float_t fVar1;
  float_t fVar2;
  mat3 *in_RDI;
  
  fVar1 = values->y;
  fVar2 = values->z;
  in_RDI->m[0].x = values->x;
  in_RDI->m[0].y = 0.0;
  in_RDI->m[0].z = 0.0;
  in_RDI->m[1].x = 0.0;
  in_RDI->m[1].y = fVar1;
  *(undefined8 *)&in_RDI->m[1].z = 0;
  in_RDI->m[2].y = 0.0;
  in_RDI->m[2].z = fVar2;
  return in_RDI;
}

Assistant:

mat3 mat3::scale(const vec3& values)
{
    return mat3(values[0], 0, 0,
                0, values[1], 0,
                0, 0, values[2]);
}